

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strpos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_50;
  sxi32 rc;
  sxu32 nOfft;
  int nStart;
  int nPatLen;
  int nLen;
  char *zPattern;
  char *zBlob;
  ProcStringMatch xPatternMatch;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zBlob = (char *)SyBlobSearch;
  xPatternMatch = (ProcStringMatch)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zPattern = jx9_value_to_string(*apArg,&nStart);
    _nPatLen = jx9_value_to_string(*(jx9_value **)(xPatternMatch + 8),(int *)&nOfft);
    local_50 = 0;
    rc = 0;
    if (2 < apArg_local._4_4_) {
      rc = jx9_value_to_int(*(jx9_value **)(xPatternMatch + 0x10));
      if (rc < 0) {
        rc = -rc;
      }
      if (rc < nStart) {
        zPattern = zPattern + rc;
        nStart = nStart - rc;
      }
      else {
        rc = 0;
      }
    }
    if ((nStart < 1) || ((int)nOfft < 1)) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      iVar1 = (*(code *)zBlob)(zPattern,nStart,_nPatLen,nOfft,&local_50);
      if (iVar1 == 0) {
        jx9_result_int64(pjStack_18,(ulong)(uint)(local_50 + rc));
      }
      else {
        jx9_result_bool(pjStack_18,0);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strpos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen, nStart;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	nStart = 0;
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
		}
		if( nStart >= nLen ){
			/* Invalid offset */
			nStart = 0;
		}else{
			zBlob += nStart;
			nLen -= nStart;
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the pattern position */
		jx9_result_int64(pCtx, (jx9_int64)(nOfft+nStart));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}